

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_smin32_tricore(void *d,void *a,void *b,uint32_t desc)

{
  intptr_t oprsz_00;
  int local_48;
  int32_t dd;
  int32_t bb;
  int32_t aa;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *b_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (_bb = 0; _bb < oprsz_00; _bb = _bb + 4) {
    local_48 = *(int *)((long)b + _bb);
    if (*(int *)((long)a + _bb) < local_48) {
      local_48 = *(int *)((long)a + _bb);
    }
    *(int *)((long)d + _bb) = local_48;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_smin32)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int32_t)) {
        int32_t aa = *(int32_t *)((char *)a + i);
        int32_t bb = *(int32_t *)((char *)b + i);
        int32_t dd = aa < bb ? aa : bb;
        *(int32_t *)((char *)d + i) = dd;
    }
    clear_high(d, oprsz, desc);
}